

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O0

void ini_property_remove(ini_t *ini,int section,int property)

{
  int iVar1;
  int iVar2;
  int p;
  int property_local;
  int section_local;
  ini_t *ini_local;
  
  if ((((ini != (ini_t *)0x0) && (-1 < section)) && (section < ini->section_count)) &&
     (iVar1 = ini_internal_property_index(ini,section,property), iVar1 != -1)) {
    if (ini->properties[iVar1].value_large != (char *)0x0) {
      sx__free((sx_alloc *)ini->memctx,ini->properties[iVar1].value_large,0,(char *)0x0,(char *)0x0,
               0);
    }
    if (ini->properties[iVar1].name_large != (char *)0x0) {
      sx__free((sx_alloc *)ini->memctx,ini->properties[iVar1].name_large,0,(char *)0x0,(char *)0x0,0
              );
    }
    iVar2 = ini->property_count + -1;
    ini->property_count = iVar2;
    memcpy(ini->properties + iVar1,ini->properties + iVar2,0x78);
  }
  return;
}

Assistant:

void ini_property_remove( ini_t* ini, int section, int property )
    {
    int p;

    if( ini && section >= 0 && section < ini->section_count )
        {
        p = ini_internal_property_index( ini, section, property );
        if( p != INI_NOT_FOUND )
            {
            if( ini->properties[ p ].value_large ) INI_FREE( ini->memctx, ini->properties[ p ].value_large );
            if( ini->properties[ p ].name_large ) INI_FREE( ini->memctx, ini->properties[ p ].name_large );
            ini->properties[ p ] = ini->properties[ --ini->property_count  ];
            return;
            }
        }
    }